

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O3

uint64_t __thiscall TxReconciliationTracker::Impl::PreRegisterPeer(Impl *this,NodeId peer_id)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  __buckets_ptr pp_Var6;
  NodeId NVar7;
  bool bVar8;
  Logger *this_00;
  _Hash_node_base *p_Var9;
  _Hash_node_base *p_Var10;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var11;
  ulong uVar12;
  size_type __n;
  _Hash_node_base _Var13;
  ulong uVar14;
  pointer __ptr;
  long in_FS_OFFSET;
  string_view source_file;
  undefined1 auVar15 [16];
  string_view logging_function;
  NodeId peer_id_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock12;
  __buckets_alloc_type __alloc;
  ChaCha20 local_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock12.super_unique_lock._M_owns = false;
  peer_id_local = peer_id;
  criticalblock12.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&criticalblock12.super_unique_lock);
  this_00 = LogInstance();
  bVar8 = BCLog::Logger::WillLogCategoryLevel(this_00,TXRECONCILIATION,Debug);
  if (bVar8) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/txreconciliation.cpp"
    ;
    source_file._M_len = 0x69;
    logging_function._M_str = "PreRegisterPeer";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<long>
              (logging_function,source_file,0x57,TXRECONCILIATION,Debug,
               (ConstevalFormatString<1U>)0xf96de3,&peer_id_local);
  }
  FastRandomContext::FastRandomContext((FastRandomContext *)&__alloc,false);
  p_Var9 = (_Hash_node_base *)FastRandomContext::rand64((FastRandomContext *)&__alloc);
  ChaCha20::~ChaCha20(&local_b0);
  p_Var10 = (_Hash_node_base *)operator_new(0x30);
  NVar7 = peer_id_local;
  p_Var10->_M_nxt = (_Hash_node_base *)0x0;
  p_Var10[1]._M_nxt = (_Hash_node_base *)peer_id_local;
  p_Var10[2]._M_nxt = p_Var9;
  *(undefined1 *)&p_Var10[5]._M_nxt = 0;
  uVar14 = (this->m_states)._M_h._M_bucket_count;
  uVar12 = (ulong)peer_id_local % uVar14;
  p_Var3 = (this->m_states)._M_h._M_buckets[uVar12];
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var4 = p_Var3->_M_nxt;
    p_Var5 = p_Var4[1]._M_nxt;
    do {
      if (p_Var5 == (_Hash_node_base *)peer_id_local) {
        operator_delete(p_Var10,0x30);
        goto LAB_0096f03d;
      }
      p_Var4 = p_Var4->_M_nxt;
    } while ((p_Var4 != (_Hash_node_base *)0x0) &&
            (p_Var5 = p_Var4[1]._M_nxt, (ulong)p_Var5 % uVar14 == uVar12));
  }
  auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(this->m_states)._M_h._M_rehash_policy,uVar14,
                       (this->m_states)._M_h._M_element_count);
  __n = auVar15._8_8_;
  if ((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __s = (this->m_states)._M_h._M_buckets;
  }
  else {
    if (__n == 1) {
      __s = &(this->m_states)._M_h._M_single_bucket;
      (this->m_states)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      ((new_allocator<std::__detail::_Hash_node_base_*> *)&__alloc,__n,(void *)0x0);
      memset(__s,0,__n * 8);
    }
    _Var13._M_nxt = (this->m_states)._M_h._M_before_begin._M_nxt;
    (this->m_states)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (_Var13._M_nxt != (_Hash_node_base *)0x0) {
      p_Var1 = &(this->m_states)._M_h._M_before_begin;
      uVar14 = 0;
      do {
        p_Var4 = (_Var13._M_nxt)->_M_nxt;
        uVar12 = (ulong)_Var13._M_nxt[1]._M_nxt % __n;
        if (__s[uVar12] == (_Hash_node_base *)0x0) {
          (_Var13._M_nxt)->_M_nxt = p_Var1->_M_nxt;
          p_Var1->_M_nxt = _Var13._M_nxt;
          __s[uVar12] = p_Var1;
          if ((_Var13._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
            pp_Var11 = __s + uVar14;
            goto LAB_0096efad;
          }
        }
        else {
          (_Var13._M_nxt)->_M_nxt = __s[uVar12]->_M_nxt;
          pp_Var11 = &__s[uVar12]->_M_nxt;
          uVar12 = uVar14;
LAB_0096efad:
          *pp_Var11 = _Var13._M_nxt;
        }
        _Var13._M_nxt = p_Var4;
        uVar14 = uVar12;
      } while (p_Var4 != (_Hash_node_base *)0x0);
    }
    pp_Var6 = (this->m_states)._M_h._M_buckets;
    if (&(this->m_states)._M_h._M_single_bucket != pp_Var6) {
      operator_delete(pp_Var6,(this->m_states)._M_h._M_bucket_count << 3);
    }
    (this->m_states)._M_h._M_bucket_count = __n;
    (this->m_states)._M_h._M_buckets = __s;
    uVar12 = (ulong)NVar7 % __n;
  }
  if (__s[uVar12] == (_Hash_node_base *)0x0) {
    p_Var4 = (this->m_states)._M_h._M_before_begin._M_nxt;
    p_Var10->_M_nxt = p_Var4;
    (this->m_states)._M_h._M_before_begin._M_nxt = p_Var10;
    if (p_Var4 != (_Hash_node_base *)0x0) {
      __s[(ulong)p_Var4[1]._M_nxt % (this->m_states)._M_h._M_bucket_count] = p_Var10;
      __s = (this->m_states)._M_h._M_buckets;
    }
    __s[uVar12] = &(this->m_states)._M_h._M_before_begin;
  }
  else {
    p_Var10->_M_nxt = __s[uVar12]->_M_nxt;
    __s[uVar12]->_M_nxt = p_Var10;
  }
  psVar2 = &(this->m_states)._M_h._M_element_count;
  *psVar2 = *psVar2 + 1;
LAB_0096f03d:
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (uint64_t)p_Var9;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Pre-register peer=%d\n", peer_id);
        const uint64_t local_salt{FastRandomContext().rand64()};

        // We do this exactly once per peer (which are unique by NodeId, see GetNewNodeId) so it's
        // safe to assume we don't have this record yet.
        Assume(m_states.emplace(peer_id, local_salt).second);
        return local_salt;
    }